

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612.cpp
# Opt level: O0

void LibGens::Ym2612Private::doStaticInit(void)

{
  bool bVar1;
  double dVar2;
  __type_conflict _Var3;
  double x_4;
  int i_5;
  int j;
  int j_3;
  double x_3;
  int local_40;
  int i_4;
  int j_2;
  int i_3;
  double x_2;
  int i_2;
  double x_1;
  int i_1;
  int j_1;
  double x;
  int i;
  
  SIN_TAB._0_8_ = TL_TAB + (long)PG_CUT_OFF * 4;
  SIN_TAB._16384_8_ = SIN_TAB._0_8_;
  for (x._4_4_ = 1; x._4_4_ < 0x401; x._4_4_ = x._4_4_ + 1) {
    dVar2 = sin(((double)x._4_4_ * 6.283185307179586) / 4096.0);
    dVar2 = log10(1.0 / dVar2);
    x_1._4_4_ = (int)((dVar2 * 20.0) / 0.0234375);
    if (PG_CUT_OFF < x_1._4_4_) {
      x_1._4_4_ = PG_CUT_OFF;
    }
    *(undefined1 **)(SIN_TAB + (long)(0x800 - x._4_4_) * 8) = TL_TAB + (long)x_1._4_4_ * 4;
    *(undefined1 **)(SIN_TAB + (long)x._4_4_ * 8) = TL_TAB + (long)x_1._4_4_ * 4;
    *(undefined1 **)(SIN_TAB + (long)(0x1000 - x._4_4_) * 8) =
         TL_TAB + (long)(x_1._4_4_ + 0x3000) * 4;
    *(undefined1 **)(SIN_TAB + (long)(x._4_4_ + 0x800) * 8) =
         TL_TAB + (long)(x_1._4_4_ + 0x3000) * 4;
  }
  for (x_1._0_4_ = 0; x_1._0_4_ < 0x400; x_1._0_4_ = x_1._0_4_ + 1) {
    dVar2 = sin(((double)x_1._0_4_ * 6.283185307179586) / 1024.0);
    *(int *)(LFO_ENV_TAB + (long)x_1._0_4_ * 4) = (int)(((dVar2 + 1.0) / 2.0) * 503.4666666666667);
    dVar2 = sin(((double)x_1._0_4_ * 6.283185307179586) / 1024.0);
    *(int *)(LFO_FREQ_TAB + (long)x_1._0_4_ * 4) = (int)(dVar2 * 511.0);
  }
  for (x_2._4_4_ = 0; x_2._4_4_ < 0x1000; x_2._4_4_ = x_2._4_4_ + 1) {
    dVar2 = std::pow((double)(0xfff - x_2._4_4_) / 4096.0,4096.0);
    *(int *)(ENV_TAB + (long)x_2._4_4_ * 4) = (int)(dVar2 * 4096.0);
    dVar2 = std::pow((double)x_2._4_4_ / 4096.0,4096.0);
    *(int *)(ENV_TAB + (long)(x_2._4_4_ + 0x1000) * 4) = (int)(dVar2 * 4096.0);
  }
  ENV_TAB._32768_4_ = 0xfff;
  local_40 = 0xfff;
  for (i_4 = 0; i_4 < 0x1000; i_4 = i_4 + 1) {
    while( true ) {
      bVar1 = false;
      if (local_40 != 0) {
        bVar1 = *(uint *)(ENV_TAB + (long)local_40 * 4) < (uint)i_4;
      }
      if (!bVar1) break;
      local_40 = local_40 + -1;
    }
    *(int *)(DECAY_TO_ATTACK + (long)i_4 * 4) = local_40 << 0x10;
  }
  for (x_3._4_4_ = 0; x_3._4_4_ < 0xf; x_3._4_4_ = x_3._4_4_ + 1) {
    *(int *)(SL_TAB + (long)x_3._4_4_ * 4) =
         (int)((double)(x_3._4_4_ * 3) / 0.0234375) * 0x10000 + 0x10000000;
  }
  SL_TAB._60_4_ = 0x1fff0000;
  for (x_4._4_4_ = 0; x_4._4_4_ < 0x3000; x_4._4_4_ = x_4._4_4_ + 1) {
    if (x_4._4_4_ < PG_CUT_OFF) {
      _Var3 = std::pow<int,double>(10,((double)x_4._4_4_ * 0.0234375) / 20.0);
      *(int *)(TL_TAB + (long)x_4._4_4_ * 4) = (int)(268435455.0 / _Var3);
      *(int *)(TL_TAB + (long)(x_4._4_4_ + 0x3000) * 4) = -*(int *)(TL_TAB + (long)x_4._4_4_ * 4);
    }
    else {
      *(undefined4 *)(TL_TAB + (long)x_4._4_4_ * 4) = 0;
      *(undefined4 *)(TL_TAB + (long)(x_4._4_4_ + 0x3000) * 4) = 0;
    }
  }
  memset(NULL_RATE,0,0x80);
  return;
}

Assistant:

void Ym2612Private::doStaticInit(void)
{
	// Sine table:
	// SIN_TAB[x][y] = sin(x) * y;
	// x = phase and y = volume
	SIN_TAB[0] = SIN_TAB[SIN_LENGTH / 2] = &TL_TAB[(int)PG_CUT_OFF];

	for (int i = 1; i <= SIN_LENGTH / 4; i++) {
		double x = sin(2.0 * PI * (double) (i) / (double) (SIN_LENGTH));	// Sinus
		x = 20 * log10(1 / x);	// convert to dB

		int j = (int)(x / ENV_STEP);	// Get TL range
		if (j > PG_CUT_OFF) {
			j = (int) PG_CUT_OFF;
		}

		SIN_TAB[i] = SIN_TAB[(SIN_LENGTH / 2) - i] = &TL_TAB[j];
		SIN_TAB[(SIN_LENGTH / 2) + i] = SIN_TAB[SIN_LENGTH - i] = &TL_TAB[TL_LENGTH + j];

//		LOG_MSG(ym2612, LOG_MSG_LEVEL_DEBUG3,
//			"SIN[%d][0] = %.8X    SIN[%d][0] = %.8X    SIN[%d][0] = %.8X    SIN[%d][0] = %.8X",
//			i, SIN_TAB[i][0], (SIN_LENGTH / 2) - i,
//			SIN_TAB[(SIN_LENGTH / 2) - i][0], (SIN_LENGTH / 2) + i,
//			SIN_TAB[(SIN_LENGTH / 2) + i][0], SIN_LENGTH - i,
//			SIN_TAB[SIN_LENGTH - i][0]);
	}

	// LFO table:
	for (int i = 0; i < LFO_LENGTH; i++) {
		double x = sin (2.0 * PI * (double) (i) / (double) (LFO_LENGTH));	// Sinus
		x += 1.0;
		x /= 2.0;		// positive only
		x *= 11.8 / ENV_STEP;	// adjusted to MAX envelope modulation

		LFO_ENV_TAB[i] = (int) x;

		x = sin(2.0 * PI * (double) (i) / (double) (LFO_LENGTH));	// Sinus
		x *= (double) ((1 << (LFO_HBITS - 1)) - 1);

		LFO_FREQ_TAB[i] = (int) x;

//		LOG_MSG(ym2612, LOG_MSG_LEVEL_DEBUG3,
//			"LFO[%d] = %.8X", i, LFO_ENV_TAB[i]);
	}

	// Envelope table:
	// ENV_TAB[0] -> ENV_TAB[ENV_LENGTH - 1]              = attack curve
	// ENV_TAB[ENV_LENGTH] -> ENV_TAB[2 * ENV_LENGTH - 1] = decay curve
	for (int i = 0; i < ENV_LENGTH; i++) {
		// Attack curve (x^8 - music level 2 Vectorman 2)
		double x = pow(((double)((ENV_LENGTH - 1) - i) / (double)(ENV_LENGTH)), 8);
		x *= ENV_LENGTH;

		ENV_TAB[i] = (int)x;

		// Decay curve (just linear)
		x = pow(((double) (i) / (double) (ENV_LENGTH)), 1);
		x *= ENV_LENGTH;

		ENV_TAB[ENV_LENGTH + i] = (int)x;

//		LOG_MSG(ym2612, LOG_MSG_LEVEL_DEBUG3,
//			"ATTACK[%d] = %d   DECAY[%d] = %d",
//			i, ENV_TAB[i], i, ENV_TAB[ENV_LENGTH + i]);
	}

	ENV_TAB[ENV_END >> ENV_LBITS] = ENV_LENGTH - 1;	// for the stopped state

	// Decay -> Attack table.
	// NOTE: There used to be an Attack -> Decay table,
	// but it wasn't implemented as of the original
	// port of Gens for Linux...
	for (int i = 0, j = ENV_LENGTH - 1; i < ENV_LENGTH; i++) {
		while (j && (ENV_TAB[j] < (unsigned) i))
			j--;

		DECAY_TO_ATTACK[i] = j << ENV_LBITS;
	}

	// Sustain Level table:
	for (int i = 0; i < 15; i++) {
		double x = i * 3;		// 3 and not 6 (Mickey Mania first music for test)
		x /= ENV_STEP;

		int j = (int)x;
		j <<= ENV_LBITS;

		SL_TAB[i] = j + ENV_DECAY;
	}

	int j = ENV_LENGTH - 1;		// special case : volume off
	j <<= ENV_LBITS;
	SL_TAB[15] = j + ENV_DECAY;

	// TL table:
	// [0     -  4095] = +output  [4095  - ...] = +output overflow (fill with 0)
	// [12288 - 16383] = -output  [16384 - ...] = -output overflow (fill with 0)
	for (int i = 0; i < TL_LENGTH; i++) {
		if (i >= PG_CUT_OFF) {
			// YM2612 cut off sound after 78 dB (14 bits output ?)
			TL_TAB[TL_LENGTH + i] = TL_TAB[i] = 0;
		} else {
			double x = MAX_OUT;			// Max output
			x /= pow(10, (ENV_STEP * i) / 20);	// Decibel -> Voltage

			TL_TAB[i] = (int) x;
			TL_TAB[TL_LENGTH + i] = -TL_TAB[i];
		}

//		LOG_MSG(ym2612, LOG_MSG_LEVEL_DEBUG3,
//			"TL_TAB[%d] = %.8X    TL_TAB[%d] = %.8X",
//			i, TL_TAB[i], TL_LENGTH + i, TL_TAB[TL_LENGTH + i]);
	}

	// NULL frequency rate table.
	// It's always 0.
	memset(NULL_RATE, 0, sizeof(NULL_RATE));
}